

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

bool __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::insert_internal(olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                  *this,art_key_type k,value_type v)

{
  try_update_result_type tVar1;
  value_type v_00;
  undefined1 local_48 [8];
  olc_db_leaf_unique_ptr_type cached_leaf;
  
  cached_leaf._M_t.
  super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
  ._M_head_impl =
       (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
        *)v._M_extent._M_extent_value;
  v_00._M_ptr = v._M_ptr;
  cached_leaf._M_t.
  super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
  ._M_head_impl.db =
       (_Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
        )(basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          )0x0;
  local_48 = (undefined1  [8])this;
  do {
    v_00._M_extent._M_extent_value =
         (size_t)cached_leaf._M_t.
                 super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 .
                 super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
                 ._M_head_impl;
    tVar1 = try_insert(this,k,v_00,(olc_db_leaf_unique_ptr_type *)local_48);
  } while (((ushort)tVar1.super__Optional_base<bool,_true,_true>._M_payload.
                    super__Optional_payload_base<bool> >> 8 & 1) == 0);
  std::
  unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 *)local_48);
  return (bool)(tVar1.super__Optional_base<bool,_true,_true>._M_payload.
                super__Optional_payload_base<bool>._M_payload & 1);
}

Assistant:

bool olc_db<Key, Value>::insert_internal(art_key_type k, value_type v) {
  try_update_result_type result;
  olc_db_leaf_unique_ptr_type cached_leaf{
      nullptr, detail::basic_db_leaf_deleter<olc_db<Key, Value>>{*this}};

  while (true) {
    result = try_insert(k, v, cached_leaf);
    if (result) break;
  }

  return *result;
}